

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdi::IconTiler::rearrange(IconTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  qsizetype qVar9;
  int *piVar10;
  const_reference ppQVar11;
  QList<QWidget_*> *in_RSI;
  long in_FS_OFFSET;
  QWidget *widget;
  int y;
  int x;
  int col;
  int row;
  int i;
  int nrows;
  int ncols;
  int height;
  int width;
  int n;
  QRect newGeometry;
  QPoint newPos;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QWidget *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QWidget *in_stack_ffffffffffffff78;
  QWidget *pQVar12;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_78;
  LayoutDirection direction;
  int iVar13;
  int iVar14;
  int local_18;
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x60c5c5);
  if ((!bVar2) &&
     (bVar2 = sanityCheck((QList<QWidget_*> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
     bVar2)) {
    qVar9 = QList<QWidget_*>::size(in_RSI);
    iVar3 = (int)qVar9;
    QList<QWidget_*>::at
              ((QList<QWidget_*> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_14[2] = QWidget::width((QWidget *)0x60c609);
    local_14[1] = 1;
    piVar10 = qMax<int>(local_14 + 2,local_14 + 1);
    iVar1 = *piVar10;
    QList<QWidget_*>::at
              ((QList<QWidget_*> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    iVar4 = QWidget::height((QWidget *)0x60c64c);
    local_14[0] = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ));
    local_14[0] = local_14[0] / iVar1;
    local_18 = 1;
    piVar10 = qMax<int>(local_14,&local_18);
    iVar14 = *piVar10;
    iVar5 = iVar3 / iVar14;
    iVar6 = iVar5 + (uint)(iVar3 % iVar14 != 0);
    iVar13 = 0;
    for (direction = LeftToRight; (int)direction < iVar6; direction = direction + RightToLeft) {
      for (local_78 = 0; local_78 < iVar14; local_78 = local_78 + 1) {
        iVar7 = local_78 * iVar1;
        iVar8 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             );
        iVar8 = (iVar8 - iVar4) - direction * iVar4;
        bVar2 = sanityCheck((QList<QWidget_*> *)CONCAT44(iVar7,iVar8),
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                            (char *)CONCAT44(iVar5,in_stack_ffffffffffffff70));
        if (bVar2) {
          iVar13 = iVar13 + 1;
          ppQVar11 = QList<QWidget_*>::at
                               ((QList<QWidget_*> *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          pQVar12 = *ppQVar11;
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          in_stack_ffffffffffffff5c = QPoint::x((QPoint *)0x60c7a5);
          in_stack_ffffffffffffff60 = QPoint::y((QPoint *)0x60c7b6);
          in_stack_ffffffffffffff64 = QWidget::width((QWidget *)0x60c7c4);
          QWidget::height((QWidget *)0x60c7d2);
          QRect::QRect((QRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                       in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                      );
          in_stack_ffffffffffffff68 = pQVar12;
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff68;
          QWidget::layoutDirection((QWidget *)0x60c7ff);
          QStyle::visualRect(direction,(QRect *)CONCAT44(iVar7,iVar8),
                             (QRect *)in_stack_ffffffffffffff78);
          QWidget::setGeometry((QWidget *)CONCAT44(iVar4,iVar14),(QRect *)CONCAT44(iVar6,iVar13));
          if (iVar13 == iVar3) goto LAB_0060c859;
        }
      }
    }
  }
LAB_0060c859:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IconTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty() || !sanityCheck(widgets, 0, "IconTiler"))
        return;

    const int n = widgets.size();
    const int width = qMax(widgets.at(0)->width(), 1);
    const int height = widgets.at(0)->height();
    const int ncols = qMax(domain.width() / width, 1);
    const int nrows = n / ncols + ((n % ncols) ? 1 : 0);

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = col * width;
            const int y = domain.height() - height - row * height;
            if (!sanityCheck(widgets, i, "IconTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QPoint newPos(x, y);
            QRect newGeometry = QRect(newPos.x(), newPos.y(), widget->width(), widget->height());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}